

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManFromIfLogicFindLut
              (If_Man_t *pIfMan,Gia_Man_t *pNew,If_Cut_t *pCutBest,sat_solver *pSat,
              Vec_Int_t *vLeaves,Vec_Int_t *vLits,Vec_Int_t *vCover,Vec_Int_t *vMapping,
              Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  If_DsdMan_t *pIVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  char *pcVar6;
  word *pwVar7;
  byte bVar8;
  uint uVar9;
  uint uSet;
  uint uVar10;
  int *piVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  word uFree;
  word uBound;
  int pVarsS [15];
  int pVarsB [15];
  int pVarsF [15];
  
  iVar2 = *pIfMan->pPars->pLutStruct + -0x30;
  if (iVar2 < vLeaves->nSize) {
    pIVar1 = pIfMan->pIfDsdMan;
    iVar3 = If_CutDsdLit(pIfMan,pCutBest);
    uVar4 = If_DsdManSuppSize(pIVar1,iVar3);
    if (uVar4 != (byte)pCutBest->field_0x1f) {
      __assert_fail("If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x583,
                    "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if (pIfMan->pPars->fDelayOptLut == 0) {
      pIVar1 = pIfMan->pIfDsdMan;
      iVar3 = If_CutDsdLit(pIfMan,pCutBest);
      uVar4 = If_DsdManCheckXY(pIVar1,iVar3,iVar2,1,0,1,0);
    }
    else {
      uVar4 = pCutBest->uMaskFunc;
    }
    pcVar6 = If_CutDsdPerm(pIfMan,pCutBest);
    bVar12 = 0;
    uSet = 0;
    for (uVar15 = 0; uVar15 < (byte)pCutBest->field_0x1f; uVar15 = uVar15 + 1) {
      iVar3 = Abc_Lit2Var((int)pcVar6[uVar15]);
      switch(uVar4 >> (bVar12 & 0x1f) & 3) {
      case 1:
        uSet = uSet | 1 << (iVar3 * 2 & 0x1fU);
        break;
      case 2:
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x594,
                      "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      case 3:
        uSet = uSet | 3 << ((char)iVar3 * '\x02' & 0x1fU);
      }
      bVar12 = bVar12 + 2;
    }
    pwVar7 = If_CutTruthW(pIfMan,pCutBest);
    iVar2 = If_ManSatCheckXY(pSat,iVar2,pwVar7,(uint)(byte)pCutBest->field_0x1f,uSet,&uBound,&uFree,
                             vLits);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                    ,0x597,
                    "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    bVar12 = pCutBest->field_0x1f;
    bVar8 = 0;
    uVar18 = 0;
    uVar4 = 0;
    uVar13 = 0;
    for (uVar10 = 0; bVar12 != uVar10; uVar10 = uVar10 + 1) {
      uVar9 = uVar4;
      uVar14 = uVar13;
      switch(uSet >> (bVar8 & 0x1f) & 3) {
      case 0:
        piVar11 = pVarsF;
        uVar9 = uVar4 + 1;
        break;
      case 1:
        uVar14 = uVar13 + 1;
        piVar11 = pVarsB;
        uVar4 = uVar13;
        break;
      case 2:
        __assert_fail("Value == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                      ,0x5a2,
                      "int Gia_ManFromIfLogicFindLut(If_Man_t *, Gia_Man_t *, If_Cut_t *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      case 3:
        piVar11 = pVarsS;
        uVar4 = uVar18;
        uVar18 = uVar18 + 1;
      }
      piVar11[(int)uVar4] = uVar10;
      bVar8 = bVar8 + 2;
      uVar4 = uVar9;
      uVar13 = uVar14;
    }
    vLits->nSize = 0;
    uVar16 = 0;
    uVar15 = (ulong)uVar18;
    if ((int)uVar18 < 1) {
      uVar15 = uVar16;
    }
    for (; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      iVar2 = Vec_IntEntry(vLeaves,pVarsS[uVar16]);
      Vec_IntPush(vLits,iVar2);
    }
    uVar17 = 0;
    uVar16 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar16 = uVar17;
    }
    for (; uVar16 != uVar17; uVar17 = uVar17 + 1) {
      iVar2 = Vec_IntEntry(vLeaves,pVarsB[uVar17]);
      Vec_IntPush(vLits,iVar2);
    }
    iVar2 = Gia_ManFromIfLogicCreateLut(pNew,&uBound,vLits,vCover,vMapping,vMapping2);
    vLits->nSize = 0;
    Vec_IntPush(vLits,iVar2);
    for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      iVar3 = Vec_IntEntry(vLeaves,pVarsS[uVar16]);
      Vec_IntPush(vLits,iVar3);
    }
    uVar16 = 0;
    uVar15 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar15 = uVar16;
    }
    for (; uVar15 != uVar16; uVar16 = uVar16 + 1) {
      iVar3 = Vec_IntEntry(vLeaves,pVarsF[uVar16]);
      Vec_IntPush(vLits,iVar3);
    }
    iVar3 = Gia_ManFromIfLogicCreateLut(pNew,&uFree,vLits,vCover,vMapping,vMapping2);
    Vec_IntPush(vPacking,2);
    iVar2 = Abc_Lit2Var(iVar2);
    Vec_IntPush(vPacking,iVar2);
    iVar2 = Abc_Lit2Var(iVar3);
    Vec_IntPush(vPacking,iVar2);
  }
  else {
    pwVar7 = If_CutTruthW(pIfMan,pCutBest);
    iVar3 = Gia_ManFromIfLogicCreateLut(pNew,pwVar7,vLeaves,vCover,vMapping,vMapping2);
    iVar2 = Abc_Lit2Var(iVar3);
    pGVar5 = Gia_ManObj(pNew,iVar2);
    if (iVar3 < 2) {
      return iVar3;
    }
    if (((uint)*(undefined8 *)pGVar5 & 0x9fffffff) == 0x9fffffff) {
      return iVar3;
    }
    Vec_IntPush(vPacking,1);
    iVar2 = Abc_Lit2Var(iVar3);
    Vec_IntPush(vPacking,iVar2);
  }
  Vec_IntAddToEntry(vPacking,0,1);
  return iVar3;
}

Assistant:

int Gia_ManFromIfLogicFindLut( If_Man_t * pIfMan, Gia_Man_t * pNew, If_Cut_t * pCutBest, sat_solver * pSat, Vec_Int_t * vLeaves, Vec_Int_t * vLits, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word uBound, uFree;
    int nLutSize = (int)(pIfMan->pPars->pLutStruct[0] - '0');
    int nVarsF = 0, pVarsF[IF_MAX_FUNC_LUTSIZE];
    int nVarsB = 0, pVarsB[IF_MAX_FUNC_LUTSIZE];
    int nVarsS = 0, pVarsS[IF_MAX_FUNC_LUTSIZE];
    unsigned uSetNew, uSetOld;
    int RetValue, RetValue2, k;
    char * pPerm;
    if ( Vec_IntSize(vLeaves) <= nLutSize )
    {
        RetValue = Gia_ManFromIfLogicCreateLut( pNew, If_CutTruthW(pIfMan, pCutBest), vLeaves, vCover, vMapping, vMapping2 );
        // write packing
        if ( !Gia_ObjIsCi(Gia_ManObj(pNew, Abc_Lit2Var(RetValue))) && RetValue > 1 )
        {
            Vec_IntPush( vPacking, 1 );
            Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
            Vec_IntAddToEntry( vPacking, 0, 1 );
        }
        return RetValue;
    }
    assert( If_DsdManSuppSize(pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest)) == (int)pCutBest->nLeaves );
    // find the bound set
    if ( pIfMan->pPars->fDelayOptLut )
        uSetOld = pCutBest->uMaskFunc;
    else
        uSetOld = If_DsdManCheckXY( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest), nLutSize, 1, 0, 1, 0 );
    // remap bound set
    uSetNew = 0;
    pPerm = If_CutDsdPerm( pIfMan, pCutBest );
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int iVar = Abc_Lit2Var((int)pPerm[k]);
        int Value = ((uSetOld >> (k << 1)) & 3);
        if ( Value == 1 )
            uSetNew |= (1 << (2*iVar));
        else if ( Value == 3 )
            uSetNew |= (3 << (2*iVar));
        else assert( Value == 0 );
    }
    RetValue = If_ManSatCheckXY( pSat, nLutSize, If_CutTruthW(pIfMan, pCutBest), pCutBest->nLeaves, uSetNew, &uBound, &uFree, vLits );
    assert( RetValue );
    // collect variables
    for ( k = 0; k < If_CutLeaveNum(pCutBest); k++ )
    {
        int Value = ((uSetNew >> (k << 1)) & 3);
        if ( Value == 0 )
            pVarsF[nVarsF++] = k;
        else if ( Value == 1 )
            pVarsB[nVarsB++] = k;
        else if ( Value == 3 )
            pVarsS[nVarsS++] = k;
        else assert( Value == 0 );
    }
    // collect bound set variables
    Vec_IntClear( vLits );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsB; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsB[k]) );
    RetValue = Gia_ManFromIfLogicCreateLut( pNew, &uBound, vLits, vCover, vMapping, vMapping2 );
    // collecct free set variables
    Vec_IntClear( vLits );
    Vec_IntPush( vLits, RetValue );
    for ( k = 0; k < nVarsS; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsS[k]) );
    for ( k = 0; k < nVarsF; k++ )
        Vec_IntPush( vLits, Vec_IntEntry(vLeaves, pVarsF[k]) );
    // add packing
    RetValue2 = Gia_ManFromIfLogicCreateLut( pNew, &uFree, vLits, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue) );
    Vec_IntPush( vPacking, Abc_Lit2Var(RetValue2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return RetValue2;
}